

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeBlezGroupBranch_4(MCInst *MI,uint32_t insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int64_t iVar5;
  uint32_t in_ESI;
  MCInst *in_RDI;
  bool bVar6;
  _Bool HasRs;
  uint32_t Imm;
  uint32_t Rt;
  uint32_t Rs;
  undefined8 in_stack_ffffffffffffffb8;
  MCInst *mcInst;
  MCInst *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  uVar1 = fieldFromInstruction(in_ESI,0x15,5);
  uVar2 = fieldFromInstruction(in_ESI,0x10,5);
  uVar3 = fieldFromInstruction(in_ESI,0,0x10);
  iVar5 = SignExtend64((ulong)uVar3,0x10);
  bVar6 = false;
  if (uVar2 == 0) {
    local_4 = MCDisassembler_Fail;
  }
  else {
    if (uVar1 == 0) {
      MCInst_setOpcode(in_RDI,0xfd);
    }
    else {
      bVar6 = uVar1 != uVar2;
      if (bVar6) {
        MCInst_setOpcode(in_RDI,0xd8);
      }
      else {
        MCInst_setOpcode(in_RDI,0xdc);
      }
    }
    if (bVar6) {
      in_stack_ffffffffffffffc0 = in_RDI;
      uVar4 = getReg((MCRegisterInfo *)in_RDI,(uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                     (uint)in_stack_ffffffffffffffb8);
      MCOperand_CreateReg0(in_stack_ffffffffffffffc0,uVar4);
    }
    mcInst = in_RDI;
    uVar4 = getReg((MCRegisterInfo *)in_stack_ffffffffffffffc0,(uint)((ulong)in_RDI >> 0x20),
                   (uint)in_RDI);
    MCOperand_CreateReg0(mcInst,uVar4);
    MCOperand_CreateImm0(in_RDI,(ulong)(uint)((int)iVar5 << 2));
    local_4 = MCDisassembler_Success;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeBlezGroupBranch_4(MCInst *MI, uint32_t insn,
		uint64_t Address, const MCRegisterInfo *Decoder)
{
	// If we are called then we can assume that MIPS32r6/MIPS64r6 is enabled
	// (otherwise we would have matched the BLEZL instruction from the earlier
	// ISA's instead).
	//
	// We have:
	//    0b000110 sssss ttttt iiiiiiiiiiiiiiii
	//      Invalid   if rs == 0
	//      BLEZALC   if rs == 0  && rt != 0
	//      BGEZALC   if rs == rt && rt != 0
	//      BGEUC     if rs != rt && rs != 0  && rt != 0

	uint32_t Rs = fieldFromInstruction(insn, 21, 5);
	uint32_t Rt = fieldFromInstruction(insn, 16, 5);
	uint32_t Imm = (uint32_t)SignExtend64(fieldFromInstruction(insn, 0, 16), 16) * 4;
	bool HasRs = false;

	if (Rt == 0)
		return MCDisassembler_Fail;
	else if (Rs == 0)
		MCInst_setOpcode(MI, Mips_BLEZALC);
	else if (Rs == Rt)
		MCInst_setOpcode(MI, Mips_BGEZALC);
	else {
		HasRs = true;
		MCInst_setOpcode(MI, Mips_BGEUC);
	}

	if (HasRs)
		MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rs));

	MCOperand_CreateReg0(MI, getReg(Decoder, Mips_GPR32RegClassID, Rt));

	MCOperand_CreateImm0(MI, Imm);

	return MCDisassembler_Success;
}